

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::DebugNodeTableSettings(ImGuiTableSettings *settings)

{
  bool bVar1;
  byte bVar2;
  ImGuiTableColumnSettings *pIVar3;
  char *local_60;
  char *local_48;
  char *local_40;
  ImGuiSortDirection sort_dir;
  ImGuiTableColumnSettings *column_settings;
  int n;
  ImGuiTableSettings *settings_local;
  
  bVar1 = TreeNode((void *)(ulong)settings->ID,"Settings 0x%08X (%d columns)",(ulong)settings->ID,
                   (ulong)(uint)(int)settings->ColumnsCount);
  if (bVar1) {
    BulletText("SaveFlags: 0x%08X",(ulong)(uint)settings->SaveFlags);
    BulletText("ColumnsCount: %d (max %d)",(ulong)(uint)(int)settings->ColumnsCount,
               (ulong)(uint)(int)settings->ColumnsCountMax);
    for (column_settings._4_4_ = 0; (int)column_settings._4_4_ < (int)settings->ColumnsCount;
        column_settings._4_4_ = column_settings._4_4_ + 1) {
      pIVar3 = ImGuiTableSettings::GetColumnSettings(settings);
      pIVar3 = pIVar3 + (int)column_settings._4_4_;
      if (pIVar3->SortOrder == -1) {
        bVar2 = 0;
      }
      else {
        bVar2 = pIVar3->field_0xb & 3;
      }
      if (bVar2 == 1) {
        local_40 = "Asc";
      }
      else {
        if (bVar2 == 2) {
          local_48 = "Des";
        }
        else {
          local_48 = "---";
        }
        local_40 = local_48;
      }
      if (((byte)pIVar3->field_0xb >> 3 & 1) == 0) {
        local_60 = "Width ";
      }
      else {
        local_60 = "Weight";
      }
      BulletText("Column %d Order %d SortOrder %d %s Vis %d %s %7.3f UserID 0x%08X",
                 (double)pIVar3->WidthOrWeight,(ulong)column_settings._4_4_,
                 (ulong)(uint)(int)pIVar3->DisplayOrder,(ulong)(uint)(int)pIVar3->SortOrder,local_40
                 ,(ulong)((byte)pIVar3->field_0xb >> 2 & 1),local_60,pIVar3->UserID);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTableSettings(ImGuiTableSettings* settings)
{
    if (!TreeNode((void*)(intptr_t)settings->ID, "Settings 0x%08X (%d columns)", settings->ID, settings->ColumnsCount))
        return;
    BulletText("SaveFlags: 0x%08X", settings->SaveFlags);
    BulletText("ColumnsCount: %d (max %d)", settings->ColumnsCount, settings->ColumnsCountMax);
    for (int n = 0; n < settings->ColumnsCount; n++)
    {
        ImGuiTableColumnSettings* column_settings = &settings->GetColumnSettings()[n];
        ImGuiSortDirection sort_dir = (column_settings->SortOrder != -1) ? (ImGuiSortDirection)column_settings->SortDirection : ImGuiSortDirection_None;
        BulletText("Column %d Order %d SortOrder %d %s Vis %d %s %7.3f UserID 0x%08X",
            n, column_settings->DisplayOrder, column_settings->SortOrder,
            (sort_dir == ImGuiSortDirection_Ascending) ? "Asc" : (sort_dir == ImGuiSortDirection_Descending) ? "Des" : "---",
            column_settings->IsEnabled, column_settings->IsStretch ? "Weight" : "Width ", column_settings->WidthOrWeight, column_settings->UserID);
    }
    TreePop();
}